

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Fts5Colset * sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse,Fts5Colset *p)

{
  int iVar1;
  int iVar2;
  int iOld;
  int iVar3;
  Fts5Colset *pFVar4;
  int i;
  int iVar5;
  
  iVar1 = pParse->pConfig->nCol;
  pFVar4 = (Fts5Colset *)sqlite3Fts5MallocZero(&pParse->rc,(long)iVar1 * 4 + 8);
  if (pFVar4 != (Fts5Colset *)0x0 && 0 < (long)iVar1) {
    iVar3 = 0;
    iVar5 = 0;
    do {
      if ((iVar3 < p->nCol) && (iVar5 == p->aiCol[iVar3])) {
        iVar3 = iVar3 + 1;
      }
      else {
        iVar2 = pFVar4->nCol;
        pFVar4->nCol = iVar2 + 1;
        pFVar4->aiCol[iVar2] = iVar5;
      }
      iVar5 = iVar5 + 1;
    } while (iVar1 != iVar5);
  }
  sqlite3_free(p);
  return pFVar4;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColsetInvert(Fts5Parse *pParse, Fts5Colset *p){
  Fts5Colset *pRet;
  int nCol = pParse->pConfig->nCol;

  pRet = (Fts5Colset*)sqlite3Fts5MallocZero(&pParse->rc, 
      sizeof(Fts5Colset) + sizeof(int)*nCol
  );
  if( pRet ){
    int i;
    int iOld = 0;
    for(i=0; i<nCol; i++){
      if( iOld>=p->nCol || p->aiCol[iOld]!=i ){
        pRet->aiCol[pRet->nCol++] = i;
      }else{
        iOld++;
      }
    }
  }

  sqlite3_free(p);
  return pRet;
}